

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-test.c++
# Opt level: O2

void __thiscall kj::parse::anon_unknown_0::TestCase89::run(TestCase89 *this)

{
  IteratorInput<char,_const_char_*> local_20;
  
  local_20.parent = (IteratorInput<char,_const_char_*> *)0x0;
  local_20.end = "";
  local_20.best = "foo";
  local_20.pos = "";
  IteratorInput<char,_const_char_*>::~IteratorInput(&local_20);
  return;
}

Assistant:

TEST(CommonParsers, ExactlyConstParser) {
  StringPtr text = "foo";
  Input input(text.begin(), text.end());

  Maybe<Tuple<>> result = exactlyConst<char, 'f'>()(input);
  EXPECT_TRUE(result != nullptr);
  EXPECT_FALSE(input.atEnd());

  result = exactlyConst<char, 'o'>()(input);
  EXPECT_TRUE(result != nullptr);
  EXPECT_FALSE(input.atEnd());

  result = exactlyConst<char, 'x'>()(input);
  EXPECT_TRUE(result == nullptr);
  EXPECT_FALSE(input.atEnd());

  auto parser = exactlyConst<char, 'o'>();
  ParserRef<Input, Tuple<>> wrapped = ref<Input>(parser);
  result = wrapped(input);
  EXPECT_TRUE(result != nullptr);
  EXPECT_TRUE(input.atEnd());
}